

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CMU462::OSDText::set_color(OSDText *this,int line_id,Color color)

{
  bool bVar1;
  pointer pOVar2;
  __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
  local_38;
  __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
  local_30;
  iterator it;
  int line_id_local;
  OSDText *this_local;
  Color color_local;
  
  it._M_current._4_4_ = line_id;
  local_30._M_current =
       (OSDLine *)
       std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::begin(&this->lines);
  while( true ) {
    local_38._M_current =
         (OSDLine *)
         std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::end(&this->lines);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) {
      return;
    }
    pOVar2 = __gnu_cxx::
             __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
             ::operator->(&local_30);
    if (pOVar2->id == it._M_current._4_4_) break;
    __gnu_cxx::
    __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
    ::operator++(&local_30);
  }
  pOVar2 = __gnu_cxx::
           __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
           ::operator->(&local_30);
  (pOVar2->color).r = (float)(int)color._0_8_;
  (pOVar2->color).g = (float)(int)((ulong)color._0_8_ >> 0x20);
  (pOVar2->color).b = (float)(int)color._8_8_;
  (pOVar2->color).a = (float)(int)((ulong)color._8_8_ >> 0x20);
  return;
}

Assistant:

void OSDText::set_color(int line_id, Color color) {
  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    if(it->id == line_id) {
      it->color = color;
      break;
    }
    ++it;
  }
}